

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::StreamingListener::OnTestIterationEnd
          (StreamingListener *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  string local_68;
  void *local_48 [2];
  void *local_38;
  long local_30;
  TimeInMillis local_28;
  
  bVar1 = UnitTestImpl::Passed(unit_test->impl_);
  local_28 = unit_test->impl_->elapsed_time_;
  StreamableToString<long_long>((internal *)local_48,&local_28);
  String::Format((char *)&local_38,"event=TestIterationEnd&passed=%d&elapsed_time=%sms\n",
                 (ulong)bVar1,local_48[0]);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,local_38,local_30 + (long)local_38);
  Send(this,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_38 != (void *)0x0) {
    operator_delete__(local_38);
  }
  if (local_48[0] != (void *)0x0) {
    operator_delete__(local_48[0]);
  }
  return;
}

Assistant:

void OnTestIterationEnd(const UnitTest& unit_test, int /* iteration */) {
    Send(String::Format("event=TestIterationEnd&passed=%d&elapsed_time=%sms\n",
                        unit_test.Passed(),
                        StreamableToString(unit_test.elapsed_time()).c_str()));
  }